

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O0

void __thiscall
FIX::MessageCracker::crack
          (MessageCracker *this,Message *message,SessionID *sessionID,BeginString *beginString)

{
  bool bVar1;
  Header *this_00;
  string *value;
  ApplVerID local_100;
  Session *local_a0;
  Session *pSession;
  undefined1 local_88 [8];
  ApplVerID applVerID;
  BeginString *beginString_local;
  SessionID *sessionID_local;
  Message *message_local;
  MessageCracker *this_local;
  
  applVerID.super_StringField.super_FieldBase.m_metrics._8_8_ = beginString;
  bVar1 = operator==(&beginString->super_StringField,"FIX.4.0");
  if (bVar1) {
    FIX40::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
  }
  else {
    bVar1 = operator==((StringField *)applVerID.super_StringField.super_FieldBase.m_metrics._8_8_,
                       "FIX.4.1");
    if (bVar1) {
      FIX41::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
    }
    else {
      bVar1 = operator==((StringField *)applVerID.super_StringField.super_FieldBase.m_metrics._8_8_,
                         "FIX.4.2");
      if (bVar1) {
        FIX42::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
      }
      else {
        bVar1 = operator==((StringField *)
                           applVerID.super_StringField.super_FieldBase.m_metrics._8_8_,"FIX.4.3");
        if (bVar1) {
          FIX43::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
        }
        else {
          bVar1 = operator==((StringField *)
                             applVerID.super_StringField.super_FieldBase.m_metrics._8_8_,"FIX.4.4");
          if (bVar1) {
            FIX44::MessageCracker::crack(&this->super_MessageCracker,(Message *)message,sessionID);
          }
          else {
            bVar1 = operator==((StringField *)
                               applVerID.super_StringField.super_FieldBase.m_metrics._8_8_,
                               BeginString_FIXT11);
            if (bVar1) {
              bVar1 = FIX::Message::isAdmin(message);
              if (bVar1) {
                FIXT11::MessageCracker::crack
                          (&this->super_MessageCracker,(Message *)message,sessionID);
              }
              else {
                ApplVerID::ApplVerID((ApplVerID *)local_88);
                this_00 = FIX::Message::getHeader(message);
                bVar1 = FieldMap::getFieldIfSet((FieldMap *)this_00,(FieldBase *)local_88);
                if (!bVar1) {
                  local_a0 = (Session *)FIX::Session::lookupSession(sessionID);
                  value = Session::getSenderDefaultApplVerID_abi_cxx11_(local_a0);
                  ApplVerID::ApplVerID(&local_100,value);
                  ApplVerID::operator=((ApplVerID *)local_88,&local_100);
                  ApplVerID::~ApplVerID(&local_100);
                }
                crack(this,message,sessionID,(ApplVerID *)local_88);
                ApplVerID::~ApplVerID((ApplVerID *)local_88);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void crack( const Message& message,
              const SessionID& sessionID,
              const BeginString& beginString )
  {
    if ( beginString == BeginString_FIX40 )
      ((FIX40::MessageCracker&)(*this)).crack((const FIX40::Message&) message, sessionID);
    else if ( beginString == BeginString_FIX41 )
      ((FIX41::MessageCracker&)(*this)).crack((const FIX41::Message&) message, sessionID);
    else if ( beginString == BeginString_FIX42 )
      ((FIX42::MessageCracker&)(*this)).crack((const FIX42::Message&) message, sessionID);
    else if ( beginString == BeginString_FIX43 )
      ((FIX43::MessageCracker&)(*this)).crack((const FIX43::Message&) message, sessionID);
    else if ( beginString == BeginString_FIX44 )
      ((FIX44::MessageCracker&)(*this)).crack((const FIX44::Message&) message, sessionID);
    else if ( beginString == BeginString_FIXT11 )
    {
      if( message.isAdmin() )
      {
        ((FIXT11::MessageCracker&)(*this)).crack((const FIXT11::Message&) message, sessionID);
      }
      else
      {
        ApplVerID applVerID;
        if(!message.getHeader().getFieldIfSet(applVerID))
        {
          Session* pSession = Session::lookupSession( sessionID );
          applVerID = pSession->getSenderDefaultApplVerID();
        }

        crack( message, sessionID, applVerID );
      }
    }
  }